

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationLimitsTests.cpp
# Opt level: O1

TestStatus *
vkt::tessellation::anon_unknown_1::deviceLimitsTestCase
          (TestStatus *__return_storage_ptr__,Context *context,LimitsCaseDefinition caseDef)

{
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *this;
  VkPhysicalDeviceProperties properties;
  VkPhysicalDeviceFeatures features;
  long *local_468;
  long local_460;
  long local_458 [2];
  VkPhysicalDeviceType *local_448 [2];
  VkPhysicalDeviceType local_438 [107];
  deUint32 local_28c;
  deUint32 local_288;
  deUint32 local_284;
  deUint32 local_280;
  deUint32 local_27c;
  deUint32 local_278;
  deUint32 local_274;
  deUint32 local_270;
  VkPhysicalDeviceFeatures local_10c;
  
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceFeatures(&local_10c,vk,physicalDevice);
  if (local_10c.tessellationShader != 0) {
    ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_448,vk,physicalDevice);
    if (caseDef.limitType < 8) {
      switch((ulong)caseDef & 0xffffffff) {
      case 0:
        local_270 = local_28c;
        break;
      case 1:
        local_270 = local_288;
        break;
      case 2:
        local_270 = local_284;
        break;
      case 3:
        local_270 = local_280;
        break;
      case 4:
        local_270 = local_27c;
        break;
      case 5:
        local_270 = local_278;
        break;
      case 6:
        local_270 = local_274;
        break;
      case 7:
      }
      expectGreaterOrEqual
                (__return_storage_ptr__,context->m_testCtx->m_log,caseDef.minimum,local_270);
    }
    else {
      local_468 = local_458;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Test error","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_468,
                 local_460 + (long)local_468);
      if (local_468 != local_458) {
        operator_delete(local_468,local_458[0] + 1);
      }
    }
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_448[0] = &((VkPhysicalDeviceProperties *)local_448)->deviceType;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_448,"Tessellation shader not supported","");
  tcu::NotSupportedError::NotSupportedError(this,(string *)local_448);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus deviceLimitsTestCase(Context& context, const LimitsCaseDefinition caseDef)
{
	const InstanceInterface&		vki			= context.getInstanceInterface();
	const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures	features	= getPhysicalDeviceFeatures(vki, physDevice);

	if (!features.tessellationShader)
		throw tcu::NotSupportedError("Tessellation shader not supported");

	const VkPhysicalDeviceProperties properties = getPhysicalDeviceProperties(vki, physDevice);
	tcu::TestLog&					 log		= context.getTestContext().getLog();

	switch (caseDef.limitType)
	{
		case LIMIT_MAX_TESSELLATION_GENERATION_LEVEL:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationGenerationLevel);
		case LIMIT_MAX_TESSELLATION_PATCH_SIZE:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationPatchSize);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_VERTEX_INPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerVertexInputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_VERTEX_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerVertexOutputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_PATCH_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerPatchOutputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_TOTAL_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlTotalOutputComponents);
		case LIMIT_MAX_TESSELLATION_EVALUATION_INPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationEvaluationInputComponents);
		case LIMIT_MAX_TESSELLATION_EVALUATION_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationEvaluationOutputComponents);
	}

	// Control should never get here.
	DE_FATAL("Internal test error");
	return tcu::TestStatus::fail("Test error");
}